

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  Object *pOVar2;
  Object *pOVar3;
  Array *pAVar4;
  allocator<char> aStack_498;
  allocator<char> local_497;
  allocator<char> local_496;
  allocator<char> local_495;
  allocator<char> local_494;
  allocator<char> local_493;
  allocator<char> local_492;
  allocator<char> local_491;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  Array local_390;
  Array local_370;
  Object local_350;
  Object local_318;
  Json js;
  Json json1;
  ifstream file;
  
  std::ifstream::ifstream(&file,"../test.json",_S_in);
  json::Json::Json(&js,(istream *)&file);
  json1.object.fields._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &json1.object.fields._M_t._M_impl.super__Rb_tree_header._M_header;
  json1.type = IsInvalid;
  json1.object.super_Type._vptr_Type = (_func_int **)&PTR_clone_00132ca0;
  json1.object.fields._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  json1.object.fields._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  json1.object.fields._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  json1.array.super_Type._vptr_Type = (_func_int **)&PTR_clone_00132cd8;
  json1.array.fields.
  super__Vector_base<common::XPtr<json::Type>,_common::clean_allocator<common::XPtr<json::Type>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  json1.array.fields.
  super__Vector_base<common::XPtr<json::Type>,_common::clean_allocator<common::XPtr<json::Type>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  json1.array.fields.
  super__Vector_base<common::XPtr<json::Type>,_common::clean_allocator<common::XPtr<json::Type>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  json1.object.fields._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       json1.object.fields._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  poVar1 = json::operator<<((ostream *)&std::cout,&js);
  std::endl<char,std::char_traits<char>>(poVar1);
  local_318.fields._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_318.fields._M_t._M_impl.super__Rb_tree_header._M_header;
  local_318.super_Type._vptr_Type = (_func_int **)&PTR_clone_00132ca0;
  local_318.fields._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_318.fields._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_318.fields._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_318.fields._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_318.fields._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b0,"Test String",&local_491);
  pOVar2 = json::Object::operator()(&local_318,&local_3b0,"string");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d0,"Test object",&local_492);
  local_350.fields._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_350.fields._M_t._M_impl.super__Rb_tree_header._M_header;
  local_350.super_Type._vptr_Type = (_func_int **)&PTR_clone_00132ca0;
  local_350.fields._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_350.fields._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_350.fields._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_350.fields._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_350.fields._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f0,"Foo",&local_493);
  pOVar3 = json::Object::operator()(&local_350,&local_3f0,0x20);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_410,"Bar",&local_494);
  local_370.super_Type._vptr_Type = (_func_int **)&PTR_clone_00132cd8;
  local_370.fields.
  super__Vector_base<common::XPtr<json::Type>,_common::clean_allocator<common::XPtr<json::Type>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_370.fields.
  super__Vector_base<common::XPtr<json::Type>,_common::clean_allocator<common::XPtr<json::Type>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_370.fields.
  super__Vector_base<common::XPtr<json::Type>,_common::clean_allocator<common::XPtr<json::Type>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pAVar4 = json::Array::operator()(&local_370,0x234);
  pAVar4 = json::Array::operator()(pAVar4,"Test");
  pOVar3 = json::Object::add<json::Array,json::Array>(pOVar3,&local_410,pAVar4);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_430,"Quuz",&local_495);
  local_390.super_Type._vptr_Type = (_func_int **)&PTR_clone_00132cd8;
  local_390.fields.
  super__Vector_base<common::XPtr<json::Type>,_common::clean_allocator<common::XPtr<json::Type>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_390.fields.
  super__Vector_base<common::XPtr<json::Type>,_common::clean_allocator<common::XPtr<json::Type>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_390.fields.
  super__Vector_base<common::XPtr<json::Type>,_common::clean_allocator<common::XPtr<json::Type>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pAVar4 = json::Array::operator()(&local_390,0x2a);
  pAVar4 = json::Array::operator()(pAVar4,false);
  pOVar3 = json::Object::add<json::Array,json::Array>(pOVar3,&local_430,pAVar4);
  pOVar2 = json::Object::add<json::Object,json::Object>(pOVar2,&local_3d0,pOVar3);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_450,"Test Integer",&local_496)
  ;
  pOVar2 = json::Object::operator()(pOVar2,&local_450,0x2a);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_470,"Test Float",&local_497);
  pOVar2 = json::Object::operator()(pOVar2,&local_470,3.1415);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_490,"Test Bool",&aStack_498);
  pOVar2 = json::Object::operator()(pOVar2,&local_490,false);
  poVar1 = json::operator<<((ostream *)&std::cout,pOVar2);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_490);
  std::__cxx11::string::~string((string *)&local_470);
  std::__cxx11::string::~string((string *)&local_450);
  json::Array::~Array(&local_390);
  std::__cxx11::string::~string((string *)&local_430);
  json::Array::~Array(&local_370);
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::~string((string *)&local_3f0);
  json::Object::~Object(&local_350);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_3b0);
  json::Object::~Object(&local_318);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  json::Json::~Json(&json1);
  json::Json::~Json(&js);
  std::ifstream::~ifstream(&file);
  return 0;
}

Assistant:

int main() {
    try {

        // Сделать ещё парсер yaml

        std::ifstream file("../test.json");
        json::Json js(file);
        json::Json json1;
        std::cout << js << std::endl;

        std::cout << json::Object()
                ("Test String", "string")
                ("Test object", json::Object()
                        ("Foo", 32)
                        ("Bar", json::Array()
                                (564)
                                ("Test")
                        )
                        ("Quuz", json::Array()
                                (42)
                                (false)
                        )
                )
                ("Test Integer", 42)
                ("Test Float", 3.1415)
                ("Test Bool", false) << std::endl;

        std::cout << std::endl;
   	}
    catch (std::exception const& e) {
        std::cerr << e.what() << std::endl;
    }
}